

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData::SplitData
          (ByteData *__return_storage_ptr__,ByteData *this,uint32_t size_from_top)

{
  initializer_list<unsigned_int> __l;
  reference pvVar1;
  allocator<unsigned_int> local_65;
  uint32_t local_64;
  iterator local_60;
  size_type local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  undefined1 local_38 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> ret;
  uint32_t size_from_top_local;
  ByteData *this_local;
  
  local_60 = &local_64;
  local_58 = 1;
  local_64 = size_from_top;
  ret.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = size_from_top;
  ::std::allocator<unsigned_int>::allocator(&local_65);
  __l._M_len = local_58;
  __l._M_array = local_60;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,__l,&local_65);
  SplitData((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38,this,
            &local_50);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
  ::std::allocator<unsigned_int>::~allocator(&local_65);
  pvVar1 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38,
                      0);
  ByteData(__return_storage_ptr__,pvVar1);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData ByteData::SplitData(uint32_t size_from_top) const {
  auto ret = SplitData(std::vector<uint32_t>{size_from_top});
  return ret[0];
}